

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicBoard.cpp
# Opt level: O0

void __thiscall
GraphicBoard::createTilesFromImage
          (GraphicBoard *this,QImage *sourceImage,BoardSize boardSize,size_t tileSize,
          GraphicMode graphicMode)

{
  size_t boardSize_00;
  EVP_PKEY_CTX *dst;
  int iVar1;
  TileSize TVar2;
  mapped_type *pmVar3;
  long lVar4;
  mapped_type *pmVar5;
  QImage local_98 [40];
  QImage local_70 [24];
  QImage local_58 [8];
  QImage boardImage;
  int local_40;
  size_t boardSizePixel;
  size_t boardSizeInt;
  GraphicMode graphicMode_local;
  size_t tileSize_local;
  QImage *pQStack_18;
  BoardSize boardSize_local;
  QImage *sourceImage_local;
  GraphicBoard *this_local;
  
  tileSize_local._4_4_ = boardSize;
  pQStack_18 = sourceImage;
  sourceImage_local = (QImage *)this;
  pmVar3 = std::
           map<BoardSize,_unsigned_long,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_unsigned_long>_>_>
           ::at(&Maps::boardSizeInt,(key_type *)((long)&tileSize_local + 4));
  boardSize_00 = *pmVar3;
  lVar4 = boardSize_00 * tileSize;
  QImage::QImage(local_58);
  dst = (EVP_PKEY_CTX *)pQStack_18;
  if (graphicMode == SCALED) {
    local_40 = (int)lVar4;
    QImage::scaled(local_70,(int)pQStack_18,local_40,local_40,FastTransformation);
    QImage::operator=(local_58,local_70);
    QImage::~QImage(local_70);
  }
  else {
    iVar1 = QImage::width();
    QImage::height();
    QImage::copy(local_98,dst,(EVP_PKEY_CTX *)((ulong)(iVar1 - lVar4) >> 1 & 0xffffffff));
    QImage::operator=(local_58,local_98);
    QImage::~QImage(local_98);
  }
  createTiles(this,local_58,boardSize_00,tileSize);
  TVar2 = Maps::getTileSizeByInt(tileSize);
  this->tileSize = TVar2;
  pmVar5 = std::
           map<TileSize,_FontSize,_std::less<TileSize>,_std::allocator<std::pair<const_TileSize,_FontSize>_>_>
           ::at(&Maps::tileSizeFontSize,&this->tileSize);
  this->fontSize = *pmVar5;
  QImage::~QImage(local_58);
  return;
}

Assistant:

void GraphicBoard::createTilesFromImage( QImage& sourceImage, BoardSize boardSize, size_t tileSize, GraphicMode graphicMode )
{
    size_t boardSizeInt = Maps::boardSizeInt.at( boardSize );
    size_t boardSizePixel = boardSizeInt * tileSize;

    QImage boardImage;
    if ( graphicMode == GraphicMode::SCALED )
    {
        boardImage = sourceImage.scaled( boardSizePixel, boardSizePixel );
    }
    else
    {
        boardImage = sourceImage.copy(( sourceImage.width() - boardSizePixel ) / 2,
                                      ( sourceImage.height() - boardSizePixel ) / 2,
                                        boardSizePixel,
                                        boardSizePixel );
    }

    createTiles( boardImage, boardSizeInt, tileSize );
    this->tileSize = Maps::getTileSizeByInt( tileSize );
    this->fontSize = Maps::tileSizeFontSize.at( this->tileSize );
}